

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.h
# Opt level: O0

int __thiscall vm_val_t::get_logical_only(vm_val_t *this)

{
  int *in_RDI;
  undefined4 local_4;
  
  if (*in_RDI == 2) {
    local_4 = 1;
  }
  else {
    if (*in_RDI != 1) {
      err_throw(0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int get_logical_only() const
    {
        if (typ == VM_TRUE)
            return TRUE;
        else if (typ == VM_NIL)
            return FALSE;
        else
        {
            err_throw(VMERR_BAD_TYPE_BIF);
            AFTER_ERR_THROW(return FALSE;)
        }
    }